

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall ON_Mesh::CullDegenerateFaces(ON_Mesh *this)

{
  uint uVar1;
  uint local_24;
  uint face_count1;
  uint face_count0;
  ON_Mesh *this_local;
  
  local_24 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
  DeleteComponents(this,(ON_COMPONENT_INDEX *)0x0,0,true,true,false,true);
  uVar1 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
  if (uVar1 < local_24) {
    local_24 = local_24 - uVar1;
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

unsigned int ON_Mesh::CullDegenerateFaces()
{
  const unsigned int face_count0 = m_F.UnsignedCount();
  
  DeleteComponents(
    nullptr,
    0,
    true,  // bIgnoreInvalidComponents
    true,  // bRemoveDegenerateFaces
    false, // bRemoveUnusedVertices
    true   // bRemoveEmptyNgons
    );

  const unsigned int face_count1 = m_F.UnsignedCount();

  return (face_count0 > face_count1) ? face_count0 - face_count1 : 0;
}